

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::summary(info *this)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(asStack_38);
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::operator<<(poVar1,"Tests run: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,(this->super_colored_base).super_progress_base.specs_run_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_38);
  if (0 < (this->super_colored_base).super_progress_base.specs_skipped_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[3])(asStack_38);
    poVar1 = std::operator<<(poVar1,asStack_38);
    poVar1 = std::operator<<(poVar1,"Skipped: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_skipped_);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(asStack_38);
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_succeeded_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[2])(asStack_38);
    poVar1 = std::operator<<(poVar1,asStack_38);
    poVar1 = std::operator<<(poVar1,"Passed: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_succeeded_);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(asStack_38);
  }
  if (0 < (this->super_colored_base).super_progress_base.specs_failed_) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(asStack_38);
    poVar1 = std::operator<<(poVar1,asStack_38);
    poVar1 = std::operator<<(poVar1,"Failed: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar1,
                        (this->super_colored_base).super_progress_base.specs_failed_);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(asStack_38);
  }
  if ((this->super_colored_base).super_progress_base.test_run_errors_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(asStack_38);
    poVar1 = std::operator<<(poVar1,asStack_38);
    poVar1 = std::operator<<(poVar1,"Errors: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(asStack_38);
  }
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(asStack_38);
  poVar1 = std::operator<<(poVar1,asStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void summary() {
        stm_
            << colorizer_.emphasize()
            << "Tests run: " << specs_run_
            << std::endl;
        if (specs_skipped_ > 0) {
          stm_
              << colorizer_.neutral()
              << "Skipped: " << specs_skipped_
              << std::endl;
        }
        if (specs_succeeded_ > 0) {
          stm_
              << colorizer_.good()
              << "Passed: " << specs_succeeded_
              << std::endl;
        }
        if (specs_failed_ > 0) {
          stm_
              << colorizer_.bad()
              << "Failed: " << specs_failed_
              << std::endl;
        }
        if (test_run_errors_.size() > 0) {
          stm_
              << colorizer_.bad()
              << "Errors: " << test_run_errors_.size()
              << std::endl;
        }
        stm_
            << colorizer_.reset()
            << std::endl;
      }